

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_file_system.cpp
# Opt level: O1

void duckdb::RecursiveGlobDirectories
               (FileSystem *fs,string *path,vector<duckdb::OpenFileInfo,_true> *result,
               bool match_directory,bool join_path)

{
  undefined1 local_5a;
  undefined1 local_59;
  long *local_58;
  undefined8 uStack_50;
  code *local_48;
  code *pcStack_40;
  
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58 = (long *)0x0;
  uStack_50 = 0;
  local_5a = join_path;
  local_59 = match_directory;
  local_58 = (long *)operator_new(0x28);
  *local_58 = (long)&local_5a;
  local_58[1] = (long)fs;
  local_58[2] = (long)path;
  local_58[3] = (long)&local_59;
  local_58[4] = (long)result;
  pcStack_40 = std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/common/local_file_system.cpp:1251:21)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/common/local_file_system.cpp:1251:21)>
             ::_M_manager;
  (*fs->_vptr_FileSystem[0x10])(fs,path,&local_58,0);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,3);
  }
  return;
}

Assistant:

static void RecursiveGlobDirectories(FileSystem &fs, const string &path, vector<OpenFileInfo> &result,
                                     bool match_directory, bool join_path) {

	fs.ListFiles(path, [&](const string &fname, bool is_directory) {
		string concat;
		if (join_path) {
			concat = fs.JoinPath(path, fname);
		} else {
			concat = fname;
		}
		if (IsSymbolicLink(concat)) {
			return;
		}
		if (is_directory == match_directory) {
			result.push_back(concat);
		}
		if (is_directory) {
			RecursiveGlobDirectories(fs, concat, result, match_directory, true);
		}
	});
}